

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *this_01;
  int in_EDX;
  key_type local_60;
  string local_40;
  
  SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)(uint)this->index_in_metadata_,in_EDX);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"index","");
  this_00 = &this->vars_;
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&local_60);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,this_00,
                     "$classname$::~$classname$() {}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_service_descriptors[$index$];\n}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n  return descriptor();\n}\n\n"
                    );
  GenerateNotImplementedMethods(this,printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  io::Printer::Print(printer,this_00,
                     "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n  : channel_(channel), owns_channel_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::google::protobuf::RpcChannel* channel,\n    ::google::protobuf::Service::ChannelOwnership ownership)\n  : channel_(channel),\n    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_channel_) delete channel_;\n}\n\n"
                    );
  GenerateStubMethods(this,printer);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  vars_["index"] = SimpleItoa(index_in_metadata_);
  printer->Print(
      vars_,
      "$classname$::~$classname$() {}\n"
      "\n"
      "const ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n"
      "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
      "  return $file_namespace$::file_level_service_descriptors[$index$];\n"
      "}\n"
      "\n"
      "const ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n"
      "  return descriptor();\n"
      "}\n"
      "\n");

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  printer->Print(vars_,
    "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n"
    "  : channel_(channel), owns_channel_(false) {}\n"
    "$classname$_Stub::$classname$_Stub(\n"
    "    ::google::protobuf::RpcChannel* channel,\n"
    "    ::google::protobuf::Service::ChannelOwnership ownership)\n"
    "  : channel_(channel),\n"
    "    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n"
    "$classname$_Stub::~$classname$_Stub() {\n"
    "  if (owns_channel_) delete channel_;\n"
    "}\n"
    "\n");

  GenerateStubMethods(printer);
}